

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec2<int>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Vec2<int>_> *this,OStream *os,int version)

{
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(this->_value).x);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(this->_value).y);
  return;
}

Assistant:

void
V2iAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.x);
    Xdr::write <StreamIO> (os, _value.y);
}